

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::Close(TCPSocket *this)

{
  mutex *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Timer *this_01;
  _Manager_type p_Var1;
  Poller *pPVar2;
  int iVar3;
  _Atomic_word _Var4;
  bool bVar5;
  Ptr local_48;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  __mutex = &this->mtx;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (((this->closed)._M_base._M_i & 1U) == 0) {
    this_00 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var4 = this_00->_M_use_count;
      do {
        if (_Var4 == 0) goto LAB_00117159;
        LOCK();
        iVar3 = this_00->_M_use_count;
        bVar5 = _Var4 == iVar3;
        if (bVar5) {
          this_00->_M_use_count = _Var4 + 1;
          iVar3 = _Var4;
        }
        _Var4 = iVar3;
        UNLOCK();
      } while (!bVar5);
      this_01 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (this_01 != (Timer *)0x0 && this_00->_M_use_count != 0) {
        util::Timer::cancel(this_01);
        std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
LAB_00117159:
    this->recvTimeout = 0;
    p_Var1 = (this->recvTimeoutCallback_).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->recvTimeoutCallback_,(_Any_data *)&this->recvTimeoutCallback_,
                __destroy_functor);
      (this->recvTimeoutCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->recvTimeoutCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    this->sendTimeout = 0;
    p_Var1 = (this->sendTimeoutCallback_).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->sendTimeoutCallback_,(_Any_data *)&this->sendTimeoutCallback_,
                __destroy_functor);
      (this->sendTimeoutCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->sendTimeoutCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    LOCK();
    (this->closed)._M_base._M_i = true;
    UNLOCK();
    shutdown(this->fd,2);
    pPVar2 = this->poller_;
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_38->events;
    if (local_38 == (element_type *)0x0) {
      local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Stack_30;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Poller::Remove(pPVar2,&local_48);
    if (local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
    if ((this->closeCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      bVar5 = this->doing;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (bVar5 != false) {
        return;
      }
      pPVar2 = this->poller_;
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_38,
                 (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPSocket>);
      local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
      local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Stack_30;
      local_38 = (element_type *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Poller::PostTask(pPVar2,(Ptr *)&local_48,this->pool_);
      if (local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Stack_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      return;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void TCPSocket::Close() {
	
	auto post = false;
	{	
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this->closed) {
			return;
		}

		if(auto sp = this->timer.lock()) {
			sp->cancel();
			this->timer.reset();
		}

		this->recvTimeout = 0;
		this->recvTimeoutCallback_ = nullptr;

		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;


		this->closed.store(true);
		::shutdown(this->fd,SHUT_RDWR);
		poller_->Remove(shared_from_this());	

		if(this->closeCallback_ && !this->doing){
			post = true;
		}
	}
	if(post) {
		poller_->PostTask(shared_from_this(),this->pool_);
	}	
}